

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop.c
# Opt level: O3

void us_internal_loop_unlink(us_loop_t *loop,us_socket_context_t *context)

{
  us_socket_context_t *puVar1;
  us_socket_context_t *puVar2;
  
  puVar1 = context->next;
  if ((loop->data).head == context) {
    (loop->data).head = puVar1;
    if (puVar1 != (us_socket_context_t *)0x0) {
      puVar2 = (us_socket_context_t *)0x0;
      goto LAB_00105369;
    }
  }
  else {
    puVar2 = context->prev;
    puVar2->next = puVar1;
    if (puVar1 != (us_socket_context_t *)0x0) {
LAB_00105369:
      puVar1->prev = puVar2;
      return;
    }
  }
  return;
}

Assistant:

void us_internal_loop_unlink(struct us_loop_t *loop, struct us_socket_context_t *context) {
    if (loop->data.head == context) {
        loop->data.head = context->next;
        if (loop->data.head) {
            loop->data.head->prev = 0;
        }
    } else {
        context->prev->next = context->next;
        if (context->next) {
            context->next->prev = context->prev;
        }
    }
}